

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

bool absl::lts_20240722::str_format_internal::ConvertIntArg<unsigned_long_long>
               (unsigned_long_long v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  ushort uVar1;
  bool bVar2;
  char *pcVar3;
  FormatSinkImpl *in_R8;
  char *pcVar4;
  undefined1 auVar5 [16];
  FormatConversionSpecImpl conv_00;
  string_view v_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  undefined8 local_60;
  uint local_58;
  char *local_50;
  size_t local_48;
  char local_40 [42];
  undefined2 local_16;
  char local_14;
  char local_13 [3];
  
  conv_01.width_ = (undefined4)((ulong)register0x00000010 >> 0x20);
  conv_01._0_4_ = conv.precision_;
  conv_00._0_8_ = conv._0_8_;
  conv_01.precision_ = (int)sink;
  local_60 = conv_00._0_8_;
  local_58 = conv_01._0_4_;
  switch((ulong)conv_00._0_8_ & 0xff) {
  case 0:
    local_60._2_1_ = conv.length_mod_;
    if (local_60._2_1_ != l) {
      conv_00.precision_ = conv_01.precision_;
      anon_unknown_53::ConvertCharImpl
                ((char)v,conv_00,(FormatSinkImpl *)&switchD_00109d43::switchdataD_00110368);
      return true;
    }
    bVar2 = anon_unknown_53::ConvertWCharTImpl((anon_unknown_53 *)v,conv._0_4_,conv_01,in_R8);
    return bVar2;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = unsigned long long]"
                 );
  case 2:
  case 3:
  case 5:
  case 0x12:
    pcVar4 = local_40;
    local_50 = pcVar4;
    pcVar3 = (char *)absl::lts_20240722::numbers_internal::FastIntToBuffer(v,pcVar4);
    goto LAB_00109e51;
  case 4:
    pcVar4 = &local_14;
    do {
      pcVar4[-1] = (byte)v & 7 | 0x30;
      pcVar4 = pcVar4 + -1;
      bVar2 = 7 < v;
      v = v >> 3;
    } while (bVar2);
    break;
  case 6:
    pcVar4 = local_13;
    do {
      pcVar3 = pcVar4;
      uVar1 = *(ushort *)((long)&numbers_internal::kHexTable + (v & 0xff) * 2);
      in_R8 = (FormatSinkImpl *)(ulong)uVar1;
      *(ushort *)(pcVar3 + -3) = uVar1;
      bVar2 = 0xff < v;
      pcVar4 = pcVar3 + -2;
      v = v >> 8;
    } while (bVar2);
    pcVar4 = pcVar3 + -3;
    if (pcVar3[-3] == '0') {
      pcVar4 = pcVar3 + -2;
    }
    break;
  case 7:
    pcVar4 = &local_14;
    do {
      pcVar4[-1] = "0123456789ABCDEF"[(uint)v & 0xf];
      pcVar4 = pcVar4 + -1;
      bVar2 = 0xf < v;
      v = v >> 4;
    } while (bVar2);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    auVar5._8_4_ = (int)(v >> 0x20);
    auVar5._0_8_ = v;
    auVar5._12_4_ = 0x45300000;
    bVar2 = ConvertFloatImpl((auVar5._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)v) - 4503599627370496.0),
                             (FormatConversionSpecImpl *)&local_60,sink);
    return bVar2;
  }
  pcVar3 = &local_14;
  local_50 = pcVar4;
LAB_00109e51:
  local_48 = (long)pcVar3 - (long)pcVar4;
  if (local_60._1_1_ == kBasic) {
    v_00._M_str = local_50;
    v_00._M_len = local_48;
    FormatSinkImpl::Append(sink,v_00);
  }
  else {
    conv_02.width_ = 0;
    conv_02.conv_ = (undefined1)local_58;
    conv_02.flags_ = local_58._1_1_;
    conv_02.length_mod_ = local_58._2_1_;
    conv_02._3_1_ = local_58._3_1_;
    conv_02.precision_ = conv_01.precision_;
    anon_unknown_53::ConvertIntImplInnerSlow((anon_unknown_53 *)&local_50,local_60,conv_02,in_R8);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}